

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

Script * __thiscall
cfd::core::Address::GetLockingScript(Script *__return_storage_ptr__,Address *this)

{
  ByteData160 script_hash;
  ByteData160 local_60;
  Script local_48;
  
  Script::Script(__return_storage_ptr__);
  switch(this->addr_type_) {
  case kP2shAddress:
  case kP2shP2wshAddress:
  case kP2shP2wpkhAddress:
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                       &this->hash_);
    ByteData160::ByteData160
              (&local_60,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    if (local_48._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_48._vptr_Script,
                      (long)local_48.script_data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_48._vptr_Script)
      ;
    }
    ScriptUtil::CreateP2shLockingScript(&local_48,&local_60);
    Script::operator=(__return_storage_ptr__,&local_48);
    break;
  case kP2pkhAddress:
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                       &this->hash_);
    ByteData160::ByteData160
              (&local_60,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    if (local_48._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_48._vptr_Script,
                      (long)local_48.script_data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_48._vptr_Script)
      ;
    }
    ScriptUtil::CreateP2pkhLockingScript(&local_48,&local_60);
    Script::operator=(__return_storage_ptr__,&local_48);
    break;
  case kP2wshAddress:
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                       &this->hash_);
    ByteData256::ByteData256
              ((ByteData256 *)&local_60,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    if (local_48._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_48._vptr_Script,
                      (long)local_48.script_data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_48._vptr_Script)
      ;
    }
    ScriptUtil::CreateP2wshLockingScript(&local_48,(ByteData256 *)&local_60);
    Script::operator=(__return_storage_ptr__,&local_48);
    break;
  case kP2wpkhAddress:
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                       &this->hash_);
    ByteData160::ByteData160
              (&local_60,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    if (local_48._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_48._vptr_Script,
                      (long)local_48.script_data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_48._vptr_Script)
      ;
    }
    ScriptUtil::CreateP2wpkhLockingScript(&local_48,&local_60);
    Script::operator=(__return_storage_ptr__,&local_48);
    break;
  case kTaprootAddress:
    ByteData256::ByteData256((ByteData256 *)&local_60,&this->hash_);
    ScriptUtil::CreateTaprootLockingScript(&local_48,(ByteData256 *)&local_60);
    Script::operator=(__return_storage_ptr__,&local_48);
    break;
  default:
    goto switchD_00370113_default;
  }
  Script::~Script(&local_48);
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
switchD_00370113_default:
  return __return_storage_ptr__;
}

Assistant:

Script Address::GetLockingScript() const {
  Script locking_script;
  switch (addr_type_) {
    case AddressType::kTaprootAddress:
      locking_script =
          ScriptUtil::CreateTaprootLockingScript(ByteData256(hash_));
      break;
    case AddressType::kP2pkhAddress: {
      ByteData160 pubkey_hash(hash_.GetBytes());
      locking_script = ScriptUtil::CreateP2pkhLockingScript(pubkey_hash);
      break;
    }
    case AddressType::kP2shP2wpkhAddress:
      // fall-through
    case AddressType::kP2shP2wshAddress:
      // fall-through
    case AddressType::kP2shAddress: {
      ByteData160 script_hash(hash_.GetBytes());
      locking_script = ScriptUtil::CreateP2shLockingScript(script_hash);
      break;
    }
    case AddressType::kP2wpkhAddress: {
      ByteData160 pubkey_hash(hash_.GetBytes());
      locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey_hash);
      break;
    }
    case AddressType::kP2wshAddress: {
      ByteData256 script_hash(hash_.GetBytes());
      locking_script = ScriptUtil::CreateP2wshLockingScript(script_hash);
      break;
    }
    default:
      break;
  }
  return locking_script;
}